

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O0

int cmd_data(char *arg)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  void *rlcd;
  FILE *output;
  LYD_FORMAT informat;
  LYD_FORMAT outformat;
  lyd_node *val_tree;
  lyd_node *data;
  char *out_path;
  char *ptr;
  char **argv;
  int printopt;
  int options;
  int ret;
  int option_index;
  int argc;
  int c;
  char *arg_local;
  
  printopt = 1;
  argv._4_4_ = 0;
  argv._0_4_ = 0;
  ptr = (char *)0x0;
  data = (lyd_node *)0x0;
  val_tree = (lyd_node *)0x0;
  _informat = (lyd_node *)0x0;
  output._4_4_ = 0;
  output._0_4_ = LYD_UNKNOWN;
  rlcd = _stdout;
  ret = 1;
  _argc = arg;
  ptr = (char *)malloc(0x10);
  pcVar3 = strdup(_argc);
  *(char **)ptr = pcVar3;
  out_path = strtok(*(char **)ptr," ");
  while (out_path = strtok((char *)0x0," "), out_path != (char *)0x0) {
    pcVar3 = (char *)realloc(ptr,(long)(ret + 2) << 3);
    pFVar1 = _stderr;
    if (pcVar3 == (char *)0x0) {
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      fprintf(pFVar1,"Memory allocation failed (%s:%d, %s)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/tools/lint/commands.c"
              ,0x2ae,pcVar3);
      goto LAB_00108e2c;
    }
    *(char **)(pcVar3 + (long)ret * 8) = out_path;
    ptr = pcVar3;
    ret = ret + 1;
  }
  pcVar3 = ptr + (long)ret * 8;
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  _optind = 0;
  do {
    options = 0;
    option_index = getopt_long(ret,ptr,"d:hf:F:o:st:r:",cmd_data::long_options,&options);
    if (option_index == -1) {
      if (_optind == ret) {
        fprintf(_stderr,"Missing the data file name.\n");
      }
      else {
        iVar2 = parse_data(*(char **)(ptr + (long)_optind * 8),(LYD_FORMAT)output,
                           (int *)((long)&argv + 4),_informat,
                           *(char **)(ptr + (long)(_optind + 1) * 8),&val_tree);
        if (iVar2 == 0) {
          if ((data == (lyd_node *)0x0) ||
             (rlcd = fopen((char *)data,"w"), pFVar1 = _stderr, (FILE *)rlcd != (FILE *)0x0)) {
            if (output._4_4_ != 0) {
              if ((argv._4_4_ & 0x20) == 0) {
                lyd_print_file(rlcd,val_tree,output._4_4_,(uint)argv | 3);
              }
              else {
                lyd_print_file(rlcd,val_tree->child,output._4_4_,(uint)argv | 3);
              }
            }
            printopt = 0;
          }
          else {
            piVar4 = __errno_location();
            pcVar3 = strerror(*piVar4);
            fprintf(pFVar1,"Could not open the output file (%s).\n",pcVar3);
          }
        }
      }
LAB_00108e2c:
      free(*(void **)ptr);
      free(ptr);
      if ((rlcd != (void *)0x0) && (rlcd != _stdout)) {
        fclose((FILE *)rlcd);
      }
      lyd_free_withsiblings(_informat);
      lyd_free_withsiblings(val_tree);
      return printopt;
    }
    switch(option_index) {
    case 0x3f:
      fprintf(_stderr,"Unknown option \"%d\".\n",(ulong)(uint)(int)(char)option_index);
      goto LAB_00108e2c;
    case 0x46:
      iVar2 = strcmp((char *)_optarg,"xml");
      if (iVar2 == 0) {
        output._0_4_ = LYD_XML;
      }
      else {
        iVar2 = strcmp((char *)_optarg,"json");
        if (iVar2 == 0) {
          output._0_4_ = LYD_JSON;
        }
        else {
          iVar2 = strcmp((char *)_optarg,"lyb");
          if (iVar2 != 0) {
            fprintf(_stderr,"Unknown input format \"%s\".\n",_optarg);
            goto LAB_00108e2c;
          }
          output._0_4_ = LYD_LYB;
        }
      }
      break;
    case 100:
      iVar2 = strcmp((char *)_optarg,"all");
      if (iVar2 == 0) {
        argv._0_4_ = (uint)argv & 0xffffff0f | 0x20;
      }
      else {
        iVar2 = strcmp((char *)_optarg,"all-tagged");
        if (iVar2 == 0) {
          argv._0_4_ = (uint)argv & 0xffffff0f | 0x40;
        }
        else {
          iVar2 = strcmp((char *)_optarg,"trim");
          if (iVar2 == 0) {
            argv._0_4_ = (uint)argv & 0xffffff0f | 0x10;
          }
          else {
            iVar2 = strcmp((char *)_optarg,"implicit-tagged");
            if (iVar2 == 0) {
              argv._0_4_ = (uint)argv & 0xffffff0f | 0x80;
            }
          }
        }
      }
      break;
    case 0x66:
      iVar2 = strcmp((char *)_optarg,"xml");
      if (iVar2 == 0) {
        output._4_4_ = 1;
      }
      else {
        iVar2 = strcmp((char *)_optarg,"json");
        if (iVar2 == 0) {
          output._4_4_ = 2;
        }
        else {
          iVar2 = strcmp((char *)_optarg,"lyb");
          if (iVar2 != 0) {
            fprintf(_stderr,"Unknown output format \"%s\".\n",_optarg);
            goto LAB_00108e2c;
          }
          output._4_4_ = 3;
        }
      }
      break;
    case 0x68:
      cmd_data_help();
      printopt = 0;
      goto LAB_00108e2c;
    case 0x6f:
      if (data != (lyd_node *)0x0) {
        fprintf(_stderr,"Output specified twice.\n");
        goto LAB_00108e2c;
      }
      data = _optarg;
      break;
    case 0x72:
      if ((_informat != (lyd_node *)0x0) || ((argv._4_4_ & 0x8000) != 0)) {
        fprintf(_stderr,"The running datastore (-r) cannot be set multiple times.\n");
        goto LAB_00108e2c;
      }
      if (*(char *)&_optarg->schema == '!') {
        argv._4_4_ = argv._4_4_ | 0x8000;
      }
      else {
        _informat = (lyd_node *)lyd_parse_path(ctx,_optarg,1,0x10000);
        if (_informat == (lyd_node *)0x0) {
          fprintf(_stderr,"Failed to parse the additional data tree for validation.\n");
          goto LAB_00108e2c;
        }
      }
      break;
    case 0x73:
      argv._4_4_ = argv._4_4_ | 0xa00;
      break;
    case 0x74:
      iVar2 = strcmp((char *)_optarg,"auto");
      if (iVar2 == 0) {
        argv._4_4_ = argv._4_4_ & 0xfeffff00 | 0x10000ff;
      }
      else {
        iVar2 = strcmp((char *)_optarg,"data");
        if (iVar2 == 0) {
          argv._4_4_ = argv._4_4_ & 0xfeffff00;
        }
        else {
          iVar2 = strcmp((char *)_optarg,"config");
          if (iVar2 == 0) {
            argv._4_4_ = argv._4_4_ & 0xfeffff00 | 1;
          }
          else {
            iVar2 = strcmp((char *)_optarg,"get");
            if (iVar2 == 0) {
              argv._4_4_ = argv._4_4_ & 0xfeffff00 | 2;
            }
            else {
              iVar2 = strcmp((char *)_optarg,"getconfig");
              if (iVar2 == 0) {
                argv._4_4_ = argv._4_4_ & 0xfeffff00 | 4;
              }
              else {
                iVar2 = strcmp((char *)_optarg,"edit");
                if (iVar2 == 0) {
                  argv._4_4_ = argv._4_4_ & 0xfeffff00 | 8;
                }
                else {
                  iVar2 = strcmp((char *)_optarg,"rpc");
                  if (iVar2 == 0) {
                    argv._4_4_ = argv._4_4_ & 0xfeffff00 | 0x10;
                  }
                  else {
                    iVar2 = strcmp((char *)_optarg,"rpcreply");
                    if (iVar2 == 0) {
                      argv._4_4_ = argv._4_4_ & 0xfeffff00 | 0x20;
                    }
                    else {
                      iVar2 = strcmp((char *)_optarg,"notif");
                      if (iVar2 == 0) {
                        argv._4_4_ = argv._4_4_ & 0xfeffff00 | 0x40;
                      }
                      else {
                        iVar2 = strcmp((char *)_optarg,"yangdata");
                        if (iVar2 != 0) {
                          fprintf(_stderr,"Invalid parser option \"%s\".\n",_optarg);
                          cmd_data_help();
                          goto LAB_00108e2c;
                        }
                        argv._4_4_ = argv._4_4_ & 0xfeffff00 | 0x1000000;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

int
cmd_data(const char *arg)
{
    int c, argc, option_index, ret = 1;
    int options = 0, printopt = 0;
    char **argv = NULL, *ptr;
    const char *out_path = NULL;
    struct lyd_node *data = NULL, *val_tree = NULL;
    LYD_FORMAT outformat = LYD_UNKNOWN, informat = LYD_UNKNOWN;
    FILE *output = stdout;
    static struct option long_options[] = {
        {"defaults", required_argument, 0, 'd'},
        {"help", no_argument, 0, 'h'},
        {"format", required_argument, 0, 'f'},
        {"in-format", required_argument, 0, 'F'},
        {"option", required_argument, 0, 't'},
        {"output", required_argument, 0, 'o'},
        {"running", required_argument, 0, 'r'},
        {"strict", no_argument, 0, 's'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc + 2) * sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto cleanup;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "d:hf:F:o:st:r:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'd':
            if (!strcmp(optarg, "all")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_ALL;
            } else if (!strcmp(optarg, "all-tagged")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_ALL_TAG;
            } else if (!strcmp(optarg, "trim")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_TRIM;
            } else if (!strcmp(optarg, "implicit-tagged")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_IMPL_TAG;
            }
            break;
        case 'h':
            cmd_data_help();
            ret = 0;
            goto cleanup;
        case 'f':
            if (!strcmp(optarg, "xml")) {
                outformat = LYD_XML;
            } else if (!strcmp(optarg, "json")) {
                outformat = LYD_JSON;
            } else if (!strcmp(optarg, "lyb")) {
                outformat = LYD_LYB;
            } else {
                fprintf(stderr, "Unknown output format \"%s\".\n", optarg);
                goto cleanup;
            }
            break;
        case 'F':
            if (!strcmp(optarg, "xml")) {
                informat = LYD_XML;
            } else if (!strcmp(optarg, "json")) {
                informat = LYD_JSON;
            } else if (!strcmp(optarg, "lyb")) {
                informat = LYD_LYB;
            } else {
                fprintf(stderr, "Unknown input format \"%s\".\n", optarg);
                goto cleanup;
            }
            break;
        case 'o':
            if (out_path) {
                fprintf(stderr, "Output specified twice.\n");
                goto cleanup;
            }
            out_path = optarg;
            break;
        case 'r':
            if (val_tree || (options & LYD_OPT_NOEXTDEPS)) {
                fprintf(stderr, "The running datastore (-r) cannot be set multiple times.\n");
                goto cleanup;
            }
            if (optarg[0] == '!') {
                /* ignore extenral dependencies to the running datastore */
                options |= LYD_OPT_NOEXTDEPS;
            } else {
                /* external file with the running datastore */
                val_tree = lyd_parse_path(ctx, optarg, LYD_XML, LYD_OPT_DATA_NO_YANGLIB);
                if (!val_tree) {
                    fprintf(stderr, "Failed to parse the additional data tree for validation.\n");
                    goto cleanup;
                }
            }
            break;
        case 's':
            options |= LYD_OPT_STRICT;
            options |= LYD_OPT_OBSOLETE;
            break;
        case 't':
            if (!strcmp(optarg, "auto")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_TYPEMASK;
            } else if (!strcmp(optarg, "data")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA;
            } else if (!strcmp(optarg, "config")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_CONFIG;
            } else if (!strcmp(optarg, "get")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_GET;
            } else if (!strcmp(optarg, "getconfig")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_GETCONFIG;
            } else if (!strcmp(optarg, "edit")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_EDIT;
            } else if (!strcmp(optarg, "rpc")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPC;
            } else if (!strcmp(optarg, "rpcreply")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPCREPLY;
            } else if (!strcmp(optarg, "notif")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_NOTIF;
            } else if (!strcmp(optarg, "yangdata")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA_TEMPLATE;
            } else {
                fprintf(stderr, "Invalid parser option \"%s\".\n", optarg);
                cmd_data_help();
                goto cleanup;
            }
            break;
        case '?':
            fprintf(stderr, "Unknown option \"%d\".\n", (char)c);
            goto cleanup;
        }
    }

    /* file name */
    if (optind == argc) {
        fprintf(stderr, "Missing the data file name.\n");
        goto cleanup;
    }

    if (parse_data(argv[optind], informat, &options, val_tree, argv[optind + 1], &data)) {
        goto cleanup;
    }

    if (out_path) {
        output = fopen(out_path, "w");
        if (!output) {
            fprintf(stderr, "Could not open the output file (%s).\n", strerror(errno));
            goto cleanup;
        }
    }

    if (outformat != LYD_UNKNOWN) {
        if (options & LYD_OPT_RPCREPLY) {
            lyd_print_file(output, data->child, outformat, LYP_WITHSIBLINGS | LYP_FORMAT | printopt);
        } else {
            lyd_print_file(output, data, outformat, LYP_WITHSIBLINGS | LYP_FORMAT | printopt);
        }
    }

    ret = 0;

cleanup:
    free(*argv);
    free(argv);

    if (output && (output != stdout)) {
        fclose(output);
    }

    lyd_free_withsiblings(val_tree);
    lyd_free_withsiblings(data);

    return ret;
}